

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_end(nk_context *ctx)

{
  nk_command_buffer *b;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ushort uVar11;
  nk_panel_type nVar12;
  undefined4 uVar13;
  nk_window *pnVar14;
  nk_panel *pnVar15;
  nk_window *pnVar16;
  nk_scroll *pnVar17;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var18;
  nk_size nVar19;
  nk_size nVar20;
  nk_size nVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  nk_panel nVar25;
  nk_panel *pnVar26;
  undefined4 in_EAX;
  uint uVar27;
  int iVar28;
  nk_panel *pnVar29;
  long lVar30;
  void *pvVar31;
  uint *puVar32;
  nk_panel *pnVar33;
  nk_page_element *pe;
  nk_window *pnVar34;
  nk_context *in;
  nk_property_state *__s;
  nk_edit_state *__s_00;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  float fVar38;
  nk_vec2 nVar39;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect r_00;
  nk_flags state;
  nk_rect empty_east;
  float local_118;
  float fStack_114;
  nk_rect local_e0;
  float local_d0;
  nk_flags local_cc;
  float local_c8;
  float fStack_c4;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  float local_a8;
  float fStack_a4;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  nk_rect local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    return;
  }
  pnVar14 = ctx->current;
  if (pnVar14 == (nk_window *)0x0) {
    return;
  }
  if ((pnVar14->flags & 0x1000) != 0) goto LAB_00110a7e;
  pnVar15 = pnVar14->layout;
  if (pnVar15 != (nk_panel *)0x0) {
    b = &pnVar14->buffer;
    nVar25 = *pnVar15;
    auVar41._0_4_ =
         -(uint)(((undefined1  [400])nVar25 & (undefined1  [400])0xf6) == (undefined1  [400])0x0);
    auVar41._4_4_ =
         -(uint)(((undefined1  [400])nVar25 & (undefined1  [400])0xf6) == (undefined1  [400])0x0);
    auVar41._8_4_ =
         -(uint)(((undefined1  [400])nVar25 & (undefined1  [400])0x80000000000) ==
                (undefined1  [400])0x0);
    auVar41._12_4_ =
         -(uint)(((undefined1  [400])nVar25 & (undefined1  [400])0x80000000000) ==
                (undefined1  [400])0x0);
    uVar27 = movmskpd(in_EAX,auVar41);
    in = (nk_context *)0x0;
    if ((uVar27 & 2) != 0) {
      in = ctx;
    }
    if ((uVar27 & 1) != 0) {
      r.w = 16384.0;
      r.h = 16384.0;
      r.x = -8192.0;
      r.y = -8192.0;
      nk_push_scissor(b,r);
    }
    nVar39 = (ctx->style).window.scrollbar_size;
    local_c8 = nVar39.x;
    fStack_c4 = nVar39.y;
    uStack_c0 = 0;
    nVar39 = nk_panel_get_padding(&ctx->style,pnVar15->type);
    local_a8 = nVar39.x;
    fStack_a4 = nVar39.y;
    fVar38 = (pnVar15->row).height + pnVar15->at_y;
    pnVar15->at_y = fVar38;
    uStack_a0 = extraout_XMM0_Qb;
    if ((pnVar15->flags & 0x4400) == 0x400) {
      fVar50 = (pnVar15->bounds).y;
      if (fVar38 < (pnVar15->bounds).h + fVar50) {
        (pnVar15->bounds).h = fVar38 - fVar50;
      }
      rect.y = fVar50;
      rect.x = (pnVar14->bounds).x;
      auVar24._8_8_ = extraout_XMM0_Qb;
      auVar24._0_4_ = nVar39.x;
      auVar24._4_4_ = nVar39.y;
      auVar47._4_12_ = auVar24._4_12_;
      auVar47._0_4_ = (pnVar14->bounds).w;
      rect._8_8_ = auVar47._0_8_;
      nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
      rect_00.w = pnVar15->border + local_a8;
      rect_00.h = (pnVar15->bounds).h;
      rect_00.y = (pnVar15->bounds).y;
      rect_00.x = (pnVar14->bounds).x;
      nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
      rect_01.x = ((pnVar15->bounds).x + (pnVar15->bounds).w) - pnVar15->border;
      rect_01.y = (pnVar15->bounds).y;
      fVar50 = pnVar15->border + local_a8;
      fVar38 = (pnVar15->bounds).h;
      auVar48._4_4_ = fVar38;
      auVar48._0_4_ = fVar50;
      auVar48._8_8_ = 0;
      if ((pnVar15->offset->y == 0) && ((pnVar15->flags & 0x20) == 0)) {
        auVar48._0_4_ = fVar50 + local_c8;
        auVar48._8_8_ = 0;
      }
      rect_01._8_8_ = auVar48._0_8_;
      nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
      if ((pnVar15->offset->x != 0) && ((pnVar15->flags & 0x20) == 0)) {
        rect_02.y = (pnVar15->bounds).y + (pnVar15->bounds).h;
        rect_02.x = (pnVar14->bounds).x;
        auVar23._4_4_ = fStack_c4;
        auVar23._0_4_ = local_c8;
        auVar23._8_8_ = uStack_c0;
        auVar49._4_12_ = auVar23._4_12_;
        auVar49._0_4_ = (pnVar14->bounds).w;
        rect_02._8_8_ = auVar49._0_8_;
        nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
      }
    }
    if (((pnVar15->flags & 0x4020) == 0) &&
       (pnVar14->scrollbar_hiding_timer <= 4.0 && pnVar14->scrollbar_hiding_timer != 4.0)) {
      local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
      fVar38 = (pnVar15->bounds).y;
      scroll.x = (pnVar15->bounds).x + (pnVar15->bounds).w + local_a8;
      scroll.y = fVar38;
      fVar50 = (pnVar15->bounds).h;
      uVar11 = pnVar15->offset->y;
      scroll.h = fVar50;
      scroll.w = local_c8;
      fVar51 = pnVar15->at_y;
      if ((pnVar15->type &
          (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
          NK_PANEL_GROUP)) == 0) {
        if (pnVar14 == ctx->active) {
          bVar37 = pnVar15->has_scrolling != 0;
        }
        else {
          bVar37 = false;
        }
        if ((in == (nk_context *)0x0) || ((0.0 < (in->input).mouse.scroll_delta & bVar37) != 1)) {
          pnVar14->scrolled = 0;
        }
        else {
          pnVar14->scrolled = 1;
        }
      }
      else {
        pnVar29 = pnVar14->layout;
        pnVar26 = pnVar29;
        do {
          pnVar33 = pnVar26;
          pnVar26 = pnVar33->parent;
          pnVar16 = pnVar14;
        } while (pnVar33->parent != (nk_panel *)0x0);
        do {
          pnVar34 = pnVar16;
          pnVar16 = pnVar34->parent;
        } while (pnVar16 != (nk_window *)0x0);
        if (((pnVar34 == ctx->active) && (pnVar15->has_scrolling != 0)) && (in != (nk_context *)0x0)
           ) {
          uVar1 = (pnVar15->bounds).x;
          uVar6 = (pnVar15->bounds).y;
          fVar55 = (in->input).mouse.pos.x;
          bVar37 = false;
          if (((float)uVar1 <= fVar55) &&
             (uVar2 = (pnVar15->bounds).w, uVar7 = (pnVar15->bounds).h,
             fVar55 <= (float)uVar1 + (float)uVar2)) {
            fVar55 = (in->input).mouse.pos.y;
            bVar37 = false;
            if (((float)uVar6 <= fVar55) && (fVar55 <= (float)uVar6 + (float)uVar7)) {
              fVar55 = (pnVar33->clip).x;
              fVar46 = (pnVar15->bounds).x;
              if (((((pnVar15->bounds).w + fVar46 < fVar55) || (fVar55 + (pnVar33->clip).w < fVar46)
                   ) || (fVar55 = (pnVar33->clip).y, fVar50 + fVar38 < fVar55)) ||
                 (fVar55 + (pnVar33->clip).h < fVar38)) goto LAB_0010fe3b;
              for (; pnVar29->parent != (nk_panel *)0x0; pnVar29 = pnVar29->parent) {
                pnVar29->has_scrolling = 0;
              }
              pnVar29->has_scrolling = 0;
              bVar37 = true;
            }
          }
        }
        else {
LAB_0010fe3b:
          bVar37 = false;
        }
      }
      fVar38 = nk_do_scrollbarv((nk_flags *)&local_e0,b,scroll,(uint)bVar37,(float)uVar11,
                                (float)(int)(fVar51 - fVar38),fVar50 * 0.1,fVar50 * 0.01,
                                &(ctx->style).scrollv,&in->input,(ctx->style).font);
      pnVar17 = pnVar15->offset;
      pnVar17->y = (unsigned_short)(int)fVar38;
      if ((in != (nk_context *)0x0) && (bVar37 != false)) {
        (in->input).mouse.scroll_delta = 0.0;
      }
      local_cc = 0;
      fVar45 = (pnVar15->bounds).y + (pnVar15->bounds).h;
      fVar38 = (pnVar15->bounds).x;
      fVar50 = pnVar15->max_x;
      local_e0._0_8_ = CONCAT44(fVar45,fVar38);
      fVar51 = (pnVar15->bounds).w;
      fVar46 = (float)(int)(fVar50 - fVar38);
      font = (ctx->style).font;
      fVar55 = 1.0;
      if (1.0 <= fStack_c4) {
        fVar55 = fStack_c4;
      }
      fVar53 = fVar55 + fVar55;
      local_e0.w = fVar53;
      if (fVar53 <= fVar51) {
        local_e0.w = fVar51;
      }
      local_e0.h = fVar55;
      fVar51 = 0.0;
      if (local_e0.w < fVar46) {
        fVar52 = (float)pnVar17->x;
        fVar51 = fVar50 * 0.05;
        local_b8 = ZEXT416((uint)fVar46);
        if ((ctx->style).scrollh.show_buttons != 0) {
          local_98 = ZEXT416((uint)fVar53);
          local_68 = ZEXT416((uint)local_e0.w);
          local_d0 = fVar51;
          if (fVar50 * 0.005 <= fVar51) {
            local_d0 = fVar50 * 0.005;
          }
          local_78 = CONCAT412(fVar55,CONCAT48(fVar55,CONCAT44(fVar55,fVar55)));
          bounds.w = fVar55;
          bounds.h = fVar55;
          bounds.x = fVar38;
          bounds.y = fVar45;
          iVar28 = nk_do_button_symbol((nk_flags *)&local_88,b,bounds,
                                       (ctx->style).scrollh.dec_symbol,NK_BUTTON_REPEATER,
                                       &(ctx->style).scrollh.dec_button,&in->input,font);
          auVar41 = local_78;
          fVar50 = 0.0;
          if (iVar28 != 0) {
            fVar50 = local_d0;
          }
          local_98._4_4_ = local_68._4_4_;
          local_98._0_4_ = (float)local_68._0_4_ - (float)local_98._0_4_;
          local_98._8_4_ = local_68._8_4_;
          local_98._12_4_ = local_68._12_4_;
          fVar52 = fVar52 - fVar50;
          bounds_00.y = fVar45;
          bounds_00.x = ((float)local_68._0_4_ + fVar38) - fVar55;
          bounds_00.w = (float)local_78._0_4_;
          bounds_00.h = (float)local_78._4_4_;
          local_78 = auVar41;
          iVar28 = nk_do_button_symbol((nk_flags *)&local_88,b,bounds_00,
                                       (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                       &(ctx->style).scrollh.inc_button,&in->input,font);
          if (iVar28 != 0) {
            fVar52 = fVar52 + local_d0;
          }
          local_e0.x = fVar38 + fVar55;
          local_e0.w = (float)local_98._0_4_;
          fVar46 = (float)local_b8._0_4_;
        }
        fVar38 = local_e0.w;
        if (local_e0.w <= fVar51) {
          fVar51 = local_e0.w;
        }
        if (fVar46 - local_e0.w <= fVar52) {
          fVar52 = fVar46 - local_e0.w;
        }
        fVar50 = 0.0;
        if (0.0 <= fVar52) {
          fVar50 = fVar52;
        }
        fVar45 = (ctx->style).scrollh.border;
        fVar53 = local_e0.x;
        nVar39 = (ctx->style).scrollh.padding;
        fVar52 = nVar39.x;
        fVar54 = nVar39.y;
        local_88.x = (fVar50 / fVar46) * local_e0.w + local_e0.x + fVar45 + fVar52;
        local_88.y = local_e0.y + fVar45 + fVar54;
        local_88.w = (local_e0.w / fVar46) * local_e0.w - (fVar52 + fVar52 + fVar45 + fVar45);
        local_88.h = fVar55 - (fVar54 + fVar54 + fVar45 + fVar45);
        local_40.x = local_e0.x;
        local_40.y = local_e0.y;
        local_50.x = local_88.w + local_88.x;
        local_40.w = local_88.x - local_e0.x;
        local_50.y = local_e0.y;
        local_50.w = (local_e0.w + local_e0.x) - local_50.x;
        local_50.h = fVar55;
        local_40.h = fVar55;
        fVar51 = nk_scrollbar_behavior
                           (&local_cc,&in->input,0,&local_e0,&local_88,&local_40,&local_50,fVar50,
                            fVar46,fVar51,NK_HORIZONTAL);
        local_88.x = (fVar51 / (float)local_b8._0_4_) * fVar38 + fVar53;
        p_Var18 = (ctx->style).scrollh.draw_begin;
        if (p_Var18 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
          (*p_Var18)(b,(ctx->style).scrollh.userdata);
        }
        nk_draw_scrollbar(b,local_cc,&(ctx->style).scrollh,&local_e0,&local_88);
        p_Var18 = (ctx->style).scrollh.draw_end;
        if (p_Var18 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
          (*p_Var18)(b,(ctx->style).scrollh.userdata);
        }
      }
      pnVar15->offset->x = (unsigned_short)(int)fVar51;
    }
    if ((pnVar14->flags & 0x80) == 0) {
LAB_00110388:
      pnVar14->scrollbar_hiding_timer = 0.0;
    }
    else {
      if ((((ctx->input).mouse.delta.x != 0.0) ||
          (fVar38 = (ctx->input).mouse.delta.y, fVar38 != 0.0)) || (NAN(fVar38))) {
        bVar37 = false;
      }
      else {
        bVar37 = (ctx->input).mouse.scroll_delta == 0.0;
      }
      pnVar16 = ctx->current;
      if (pnVar16 == (nk_window *)0x0) {
LAB_00110403:
        bVar22 = false;
      }
      else {
        uVar3 = (pnVar16->bounds).x;
        uVar8 = (pnVar16->bounds).y;
        fVar38 = (ctx->input).mouse.pos.x;
        bVar22 = false;
        if (((float)uVar3 <= fVar38) &&
           (uVar4 = (pnVar16->bounds).w, uVar9 = (pnVar16->bounds).h, bVar22 = false,
           fVar38 <= (float)uVar3 + (float)uVar4)) {
          fVar38 = (ctx->input).mouse.pos.y;
          if (fVar38 < (float)uVar8) goto LAB_00110403;
          bVar22 = fVar38 <= (float)uVar8 + (float)uVar9;
        }
      }
      if ((!(bool)(bVar37 & bVar22)) &&
         (bVar22 || (char)((ctx->last_widget_state & 2) >> 1) != '\0')) goto LAB_00110388;
      pnVar14->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar14->scrollbar_hiding_timer;
    }
    uVar27 = pnVar15->flags;
    if ((uVar27 & 1) != 0) {
      nVar12 = pnVar15->type;
      lVar30 = 0x1e14;
      if ((int)nVar12 < 0x20) {
        if (nVar12 == NK_PANEL_GROUP) {
          lVar30 = 0x1e28;
        }
        else if (nVar12 == NK_PANEL_POPUP) {
          lVar30 = 0x1e18;
        }
        else if (nVar12 == NK_PANEL_CONTEXTUAL) {
          lVar30 = 0x1e20;
        }
      }
      else if (nVar12 == NK_PANEL_COMBO) {
        lVar30 = 0x1e1c;
      }
      else if ((nVar12 == NK_PANEL_MENU) || (nVar12 == NK_PANEL_TOOLTIP)) {
        lVar30 = 0x1e24;
      }
      if ((uVar27 >> 0xe & 1) == 0) {
        if ((uVar27 >> 10 & 1) == 0) {
          local_b8 = ZEXT416((uint)((pnVar14->bounds).y + (pnVar14->bounds).h));
        }
        else {
          local_b8 = ZEXT416((uint)((pnVar15->bounds).y + (pnVar15->bounds).h +
                                   pnVar15->footer_height));
        }
      }
      else {
        local_b8 = ZEXT416((uint)((ctx->style).window.border + (pnVar14->bounds).y +
                                 pnVar15->header_height));
      }
      uVar13 = *(undefined4 *)((long)&(ctx->input).keyboard.keys[0].down + lVar30);
      uVar5 = (pnVar14->bounds).x;
      uVar10 = (pnVar14->bounds).y;
      fVar38 = (pnVar14->bounds).w;
      fVar50 = pnVar15->border;
      pvVar31 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar31 != (void *)0x0) {
        *(short *)((long)pvVar31 + 0x10) = (short)(int)fVar50;
        auVar40._0_4_ = (int)(float)uVar5;
        auVar40._4_4_ = (int)(float)uVar10;
        auVar40._8_4_ = (int)(fVar38 + (float)uVar5);
        auVar40._12_4_ = (int)(float)uVar10;
        auVar41 = packssdw(auVar40,auVar40);
        *(long *)((long)pvVar31 + 0x12) = auVar41._0_8_;
        *(undefined4 *)((long)pvVar31 + 0x1a) = uVar13;
      }
      fVar38 = (pnVar14->bounds).x;
      fVar50 = (pnVar14->bounds).w;
      fVar51 = pnVar15->border;
      pvVar31 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar31 != (void *)0x0) {
        auVar42._0_4_ = (uint)fVar51;
        auVar42._4_4_ = (int)fVar38;
        auVar42._8_4_ = (int)(float)local_b8._0_4_;
        auVar42._12_4_ = (int)(fVar50 + fVar38);
        auVar41 = packssdw(auVar42,auVar42);
        *(ulong *)((long)pvVar31 + 0x10) =
             (ulong)auVar42._0_4_ & 0xffff | auVar41._0_8_ & 0xffffffffffff0000;
        *(short *)((long)pvVar31 + 0x18) = (short)auVar42._8_4_;
        *(undefined4 *)((long)pvVar31 + 0x1a) = uVar13;
      }
      fVar38 = (pnVar14->bounds).x;
      fVar50 = (pnVar14->bounds).y;
      fVar51 = pnVar15->border;
      pvVar31 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar31 != (void *)0x0) {
        fVar38 = fVar51 * 0.5 + fVar38;
        *(short *)((long)pvVar31 + 0x10) = (short)(int)fVar51;
        auVar43._0_4_ = (int)fVar38;
        auVar43._4_4_ = (int)fVar50;
        auVar43._8_4_ = (int)fVar38;
        auVar43._12_4_ = (int)(float)local_b8._0_4_;
        auVar41 = packssdw(auVar43,auVar43);
        *(long *)((long)pvVar31 + 0x12) = auVar41._0_8_;
        *(undefined4 *)((long)pvVar31 + 0x1a) = uVar13;
      }
      fVar38 = (pnVar14->bounds).x;
      fVar50 = (pnVar14->bounds).y;
      fVar51 = (pnVar14->bounds).w;
      fVar55 = pnVar15->border;
      pvVar31 = nk_command_buffer_push(b,NK_COMMAND_LINE,0x20);
      if (pvVar31 != (void *)0x0) {
        fVar38 = fVar55 * -0.5 + fVar38 + fVar51;
        *(short *)((long)pvVar31 + 0x10) = (short)(int)fVar55;
        auVar44._0_4_ = (int)fVar38;
        auVar44._4_4_ = (int)fVar50;
        auVar44._8_4_ = (int)fVar38;
        auVar44._12_4_ = (int)(float)local_b8._0_4_;
        auVar41 = packssdw(auVar44,auVar44);
        *(long *)((long)pvVar31 + 0x12) = auVar41._0_8_;
        *(undefined4 *)((long)pvVar31 + 0x1a) = uVar13;
      }
    }
    if (((pnVar15->flags & 0x4004) == 4) && (in != (nk_context *)0x0)) {
      fStack_a4 = (pnVar15->bounds).y + (pnVar15->bounds).h;
      local_a8 = (pnVar15->bounds).x + (pnVar15->bounds).w + local_a8;
      if ((pnVar15->flags & 0x20) != 0) {
        local_a8 = local_a8 - local_c8;
      }
      uStack_a0 = 0;
      if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
        r_00.y = fStack_a4;
        r_00.x = local_a8;
        r_00.h = fStack_c4;
        r_00.w = local_c8;
        nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
      }
      else {
        nk_fill_triangle(b,local_c8 + local_a8,fStack_a4,local_c8 + local_a8,fStack_c4 + fStack_a4,
                         local_a8,fStack_c4 + fStack_a4,(ctx->style).window.scaler.data.color);
      }
      if ((pnVar14->flags & 0x800) == 0) {
        iVar28 = (in->input).mouse.buttons[0].down;
        fVar38 = (in->input).mouse.buttons[0].clicked_pos.x;
        bVar37 = false;
        if ((local_a8 <= fVar38) && (bVar37 = false, fVar38 <= local_c8 + local_a8)) {
          fVar38 = (in->input).mouse.buttons[0].clicked_pos.y;
          bVar37 = iVar28 == 1 && (fVar38 <= fStack_c4 + fStack_a4 && fStack_a4 <= fVar38);
        }
        if ((iVar28 != 0) && (bVar37)) {
          fVar38 = (in->input).mouse.delta.x;
          fVar51 = (pnVar14->bounds).w + fVar38;
          fVar50 = (ctx->style).window.min_size.x;
          if (fVar51 <= fVar50) {
            fVar51 = fVar50;
          }
          fVar50 = (ctx->style).window.min_size.y;
          (pnVar14->bounds).w = fVar51;
          if ((pnVar15->flags & 0x400) == 0) {
            fVar51 = (pnVar14->bounds).h + (in->input).mouse.delta.y;
            if (fVar51 <= fVar50) {
              fVar51 = fVar50;
            }
            (pnVar14->bounds).h = fVar51;
          }
          (ctx->style).cursor_active = (ctx->style).cursors[6];
          nVar39.y = fStack_a4 + (in->input).mouse.delta.y + fStack_c4 * 0.5;
          nVar39.x = local_a8 + fVar38 + local_c8 * 0.5;
          (in->input).mouse.buttons[0].clicked_pos = nVar39;
        }
      }
    }
    if ((pnVar15->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == 0) {
      if ((pnVar15->flags & 0x1000) == 0) {
        (pnVar14->buffer).end = (ctx->memory).allocated;
        pnVar29 = pnVar14->layout;
        if ((pnVar29->popup_buffer).active != 0) {
          pvVar31 = (ctx->memory).memory.ptr;
          nVar19 = (pnVar29->popup_buffer).last;
          nVar20 = (pnVar14->buffer).last;
          nVar21 = (pnVar29->popup_buffer).end;
          *(nk_size *)((long)pvVar31 + (pnVar29->popup_buffer).parent + 8) = nVar21;
          *(undefined8 *)((long)pvVar31 + nVar19 + 8) = *(undefined8 *)((long)pvVar31 + nVar20 + 8);
          *(nk_size *)((long)pvVar31 + nVar20 + 8) = (pnVar29->popup_buffer).begin;
          (pnVar14->buffer).last = nVar19;
          (pnVar14->buffer).end = nVar21;
          (pnVar29->popup_buffer).active = 0;
        }
      }
      else {
        (pnVar14->buffer).begin = 0;
        (pnVar14->buffer).end = 0;
        (pnVar14->buffer).last = 0;
        (pnVar14->buffer).clip = nk_null_rect;
      }
    }
    if ((short)pnVar15->flags < 0) {
      pnVar15->flags = pnVar15->flags & 0xffff77ff;
    }
    pnVar14->flags = pnVar15->flags;
    iVar28 = (pnVar14->property).active;
    if (((iVar28 == 0) || ((pnVar14->property).old == (pnVar14->property).seq)) ||
       (iVar28 != (pnVar14->property).prev)) {
      (pnVar14->property).old = (pnVar14->property).seq;
      (pnVar14->property).prev = iVar28;
      (pnVar14->property).seq = 0;
    }
    else {
      __s = &pnVar14->property;
      uVar35 = (ulong)__s & 3;
      if (uVar35 == 0) {
        uVar36 = 0x60;
      }
      else {
        memset(__s,0,4 - uVar35);
        uVar36 = uVar35 | 0x5c;
        __s = (nk_property_state *)((long)__s + (4 - uVar35));
      }
      uVar35 = (ulong)((uint)uVar36 & 0xfffffffc);
      memset(__s,0,uVar35);
      if ((uVar36 & 3) != 0) {
        memset(__s->buffer + (uVar35 - 8),0,uVar36 & 3);
      }
    }
    iVar28 = (pnVar14->edit).active;
    if (((iVar28 == 0) || ((pnVar14->edit).old == (pnVar14->edit).seq)) ||
       (iVar28 != (pnVar14->edit).prev)) {
      (pnVar14->edit).old = (pnVar14->edit).seq;
      (pnVar14->edit).prev = iVar28;
      (pnVar14->edit).seq = 0;
    }
    else {
      __s_00 = &pnVar14->edit;
      uVar35 = (ulong)__s_00 & 3;
      if (uVar35 == 0) {
        uVar36 = 0x28;
      }
      else {
        memset(__s_00,0,4 - uVar35);
        uVar36 = uVar35 | 0x24;
        __s_00 = (nk_edit_state *)((long)__s_00 + (4 - uVar35));
      }
      uVar35 = (ulong)((uint)uVar36 & 0xfffffffc);
      memset(__s_00,0,uVar35);
      if ((uVar36 & 3) != 0) {
        memset((void *)((long)&__s_00->name + uVar35),0,uVar36 & 3);
      }
    }
    if (((pnVar14->popup).active_con == 0) ||
       ((pnVar14->popup).con_old == (pnVar14->popup).con_count)) {
      puVar32 = &(pnVar14->popup).con_count;
      (pnVar14->popup).con_old = (pnVar14->popup).con_count;
    }
    else {
      puVar32 = &(pnVar14->popup).active_con;
      (pnVar14->popup).con_count = 0;
      (pnVar14->popup).con_old = 0;
    }
    *puVar32 = 0;
    (pnVar14->popup).combo_count = 0;
  }
  nk_free_page_element(ctx,(nk_page_element *)ctx->current->layout);
LAB_00110a7e:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current) return;
    if (ctx->current->flags & NK_WINDOW_HIDDEN) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}